

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::createUnaryOperation
          (TGlslangToSpvTraverser *this,TOperator op,OpDecorations *decorations,Id typeId,Id operand
          ,TBasicType typeProxy,CoherentFlags *lvalueCoherentFlags,TType *opType)

{
  bool bVar1;
  bool bVar2;
  Id IVar3;
  Id local_d4;
  undefined1 local_b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> args;
  undefined1 local_90 [4];
  Id id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  int local_40;
  bool isFloat;
  Id IStack_3c;
  bool isUnsigned;
  int libCall;
  int extBuiltins;
  Op unaryOp;
  TBasicType typeProxy_local;
  Id operand_local;
  Id typeId_local;
  OpDecorations *decorations_local;
  TGlslangToSpvTraverser *pTStack_18;
  TOperator op_local;
  TGlslangToSpvTraverser *this_local;
  
  libCall = 0;
  IStack_3c = 0xffffffff;
  local_40 = -1;
  unaryOp = operand;
  typeProxy_local = typeId;
  _operand_local = decorations;
  decorations_local._4_4_ = op;
  pTStack_18 = this;
  bVar1 = glslang::isTypeUnsignedInt(typeProxy);
  bVar2 = glslang::isTypeFloat(typeProxy);
  switch(decorations_local._4_4_) {
  case EOpNegative:
    if (bVar2) {
      libCall = 0x7f;
      bVar1 = spv::Builder::isMatrixType(&this->builder,typeProxy_local);
      if (bVar1) {
        IVar3 = createUnaryMatrixOperation
                          (this,OpFNegate,_operand_local,typeProxy_local,unaryOp,typeProxy);
        return IVar3;
      }
    }
    else {
      libCall = 0x7e;
    }
    break;
  case EOpLogicalNot:
  case EOpVectorLogicalNot:
    libCall = 0xa8;
    break;
  case EOpBitwiseNot:
    libCall = 200;
    break;
  default:
    return 0;
  case EOpCopyObject:
    libCall = 0x53;
    break;
  case EOpConvUint64ToAccStruct:
  case EOpConvUvec2ToAccStruct:
    libCall = 0x115f;
    break;
  case EOpRadians:
    local_40 = 0xb;
    break;
  case EOpDegrees:
    local_40 = 0xc;
    break;
  case EOpSin:
    local_40 = 0xd;
    break;
  case EOpCos:
    local_40 = 0xe;
    break;
  case EOpTan:
    local_40 = 0xf;
    break;
  case EOpAsin:
    local_40 = 0x10;
    break;
  case EOpAcos:
    local_40 = 0x11;
    break;
  case EOpAtan:
    local_40 = 0x12;
    break;
  case EOpSinh:
    local_40 = 0x13;
    break;
  case EOpCosh:
    local_40 = 0x14;
    break;
  case EOpTanh:
    local_40 = 0x15;
    break;
  case EOpAsinh:
    local_40 = 0x16;
    break;
  case EOpAcosh:
    local_40 = 0x17;
    break;
  case EOpAtanh:
    local_40 = 0x18;
    break;
  case EOpExp:
    local_40 = 0x1b;
    break;
  case EOpLog:
    local_40 = 0x1c;
    break;
  case EOpExp2:
    local_40 = 0x1d;
    break;
  case EOpLog2:
    local_40 = 0x1e;
    break;
  case EOpSqrt:
    local_40 = 0x1f;
    break;
  case EOpInverseSqrt:
    local_40 = 0x20;
    break;
  case EOpAbs:
    if (bVar2) {
      local_40 = 4;
    }
    else {
      local_40 = 5;
    }
    break;
  case EOpSign:
    if (bVar2) {
      local_40 = 6;
    }
    else {
      local_40 = 7;
    }
    break;
  case EOpFloor:
    local_40 = 8;
    break;
  case EOpTrunc:
    local_40 = 3;
    break;
  case EOpRound:
    local_40 = 1;
    break;
  case EOpRoundEven:
    local_40 = 2;
    break;
  case EOpCeil:
    local_40 = 9;
    break;
  case EOpFract:
    local_40 = 10;
    break;
  case EOpIsNan:
    libCall = 0x9c;
    break;
  case EOpIsInf:
    libCall = 0x9d;
    break;
  case EOpFloatBitsToInt:
  case EOpFloatBitsToUint:
  case EOpIntBitsToFloat:
  case EOpUintBitsToFloat:
  case EOpDoubleBitsToInt64:
  case EOpDoubleBitsToUint64:
  case EOpInt64BitsToDouble:
  case EOpUint64BitsToDouble:
  case EOpFloat16BitsToInt16:
  case EOpFloat16BitsToUint16:
  case EOpInt16BitsToFloat16:
  case EOpUint16BitsToFloat16:
    libCall = 0x7c;
    break;
  case EOpPackSnorm2x16:
    local_40 = 0x38;
    break;
  case EOpUnpackSnorm2x16:
    local_40 = 0x3c;
    break;
  case EOpPackUnorm2x16:
    local_40 = 0x39;
    break;
  case EOpUnpackUnorm2x16:
    local_40 = 0x3d;
    break;
  case EOpPackSnorm4x8:
    local_40 = 0x36;
    break;
  case EOpUnpackSnorm4x8:
    local_40 = 0x3f;
    break;
  case EOpPackUnorm4x8:
    local_40 = 0x37;
    break;
  case EOpUnpackUnorm4x8:
    local_40 = 0x40;
    break;
  case EOpPackHalf2x16:
    local_40 = 0x3a;
    break;
  case EOpUnpackHalf2x16:
    local_40 = 0x3e;
    break;
  case EOpPackDouble2x32:
    local_40 = 0x3b;
    break;
  case EOpUnpackDouble2x32:
    local_40 = 0x41;
    break;
  case EOpPackInt2x32:
  case EOpUnpackInt2x32:
  case EOpPackUint2x32:
  case EOpUnpackUint2x32:
  case EOpPackFloat2x16:
  case EOpUnpackFloat2x16:
  case EOpPackInt2x16:
  case EOpUnpackInt2x16:
  case EOpPackUint2x16:
  case EOpUnpackUint2x16:
  case EOpPackInt4x16:
  case EOpUnpackInt4x16:
  case EOpPackUint4x16:
  case EOpUnpackUint4x16:
  case EOpPack16:
  case EOpPack32:
  case EOpPack64:
  case EOpUnpack32:
  case EOpUnpack16:
  case EOpUnpack8:
    libCall = 0x7c;
    break;
  case EOpLength:
    local_40 = 0x42;
    break;
  case EOpNormalize:
    local_40 = 0x45;
    break;
  case EOpDPdx:
    libCall = 0xcf;
    break;
  case EOpDPdy:
    libCall = 0xd0;
    break;
  case EOpFwidth:
    libCall = 0xd1;
    break;
  case EOpDPdxFine:
    libCall = 0xd2;
    break;
  case EOpDPdyFine:
    libCall = 0xd3;
    break;
  case EOpFwidthFine:
    libCall = 0xd4;
    break;
  case EOpDPdxCoarse:
    libCall = 0xd5;
    break;
  case EOpDPdyCoarse:
    libCall = 0xd6;
    break;
  case EOpFwidthCoarse:
    libCall = 0xd7;
    break;
  case EOpInterpolateAtCentroid:
    if (typeProxy == EbtFloat16) {
      spv::Builder::addExtension(&this->builder,"SPV_AMD_gpu_shader_half_float");
    }
    local_40 = 0x4c;
    break;
  case EOpDeterminant:
    local_40 = 0x21;
    break;
  case EOpMatrixInverse:
    local_40 = 0x22;
    break;
  case EOpTranspose:
    libCall = 0x54;
    break;
  case EOpBallot:
  case EOpReadFirstInvocation:
  case EOpAnyInvocation:
  case EOpAllInvocations:
  case EOpAllInvocationsEqual:
  case EOpMinInvocations:
  case EOpMaxInvocations:
  case EOpAddInvocations:
  case EOpMinInvocationsNonUniform:
  case EOpMaxInvocationsNonUniform:
  case EOpAddInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScan:
  case EOpMaxInvocationsInclusiveScan:
  case EOpAddInvocationsInclusiveScan:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
  case EOpAddInvocationsExclusiveScan:
  case EOpMinInvocationsExclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &operands_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &operands_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&unaryOp);
    this_local._4_4_ =
         createInvocationsOperation
                   (this,decorations_local._4_4_,typeProxy_local,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &operands_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,typeProxy);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &operands_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return this_local._4_4_;
  case EOpSubgroupAll:
  case EOpSubgroupAny:
  case EOpSubgroupAllEqual:
  case EOpSubgroupBroadcastFirst:
  case EOpSubgroupBallot:
  case EOpSubgroupInverseBallot:
  case EOpSubgroupBallotBitCount:
  case EOpSubgroupBallotInclusiveBitCount:
  case EOpSubgroupBallotExclusiveBitCount:
  case EOpSubgroupBallotFindLSB:
  case EOpSubgroupBallotFindMSB:
  case EOpSubgroupAdd:
  case EOpSubgroupMul:
  case EOpSubgroupMin:
  case EOpSubgroupMax:
  case EOpSubgroupAnd:
  case EOpSubgroupOr:
  case EOpSubgroupXor:
  case EOpSubgroupInclusiveAdd:
  case EOpSubgroupInclusiveMul:
  case EOpSubgroupInclusiveMin:
  case EOpSubgroupInclusiveMax:
  case EOpSubgroupInclusiveAnd:
  case EOpSubgroupInclusiveOr:
  case EOpSubgroupInclusiveXor:
  case EOpSubgroupExclusiveAdd:
  case EOpSubgroupExclusiveMul:
  case EOpSubgroupExclusiveMin:
  case EOpSubgroupExclusiveMax:
  case EOpSubgroupExclusiveAnd:
  case EOpSubgroupExclusiveOr:
  case EOpSubgroupExclusiveXor:
  case EOpSubgroupQuadSwapHorizontal:
  case EOpSubgroupQuadSwapVertical:
  case EOpSubgroupQuadSwapDiagonal:
  case EOpSubgroupQuadAll:
  case EOpSubgroupQuadAny:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,&unaryOp);
    this_local._4_4_ =
         createSubgroupOperation
                   (this,decorations_local._4_4_,typeProxy_local,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90,typeProxy);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_90);
    return this_local._4_4_;
  case EOpSubgroupPartition:
    libCall = 0x14b0;
    break;
  case EOpMbcnt:
    IStack_3c = getExtBuiltins(this,"SPV_AMD_shader_ballot");
    local_40 = 4;
    break;
  case EOpCubeFaceIndex:
    IStack_3c = getExtBuiltins(this,"SPV_AMD_gcn_shader");
    local_40 = 1;
    break;
  case EOpCubeFaceCoord:
    IStack_3c = getExtBuiltins(this,"SPV_AMD_gcn_shader");
    local_40 = 2;
    break;
  case EOpAtomicCounterIncrement:
  case EOpAtomicCounterDecrement:
  case EOpAtomicCounter:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &operands_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &operands_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&unaryOp);
    this_local._4_4_ =
         createAtomicOperation
                   (this,decorations_local._4_4_,_operand_local->precision,typeProxy_local,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &operands_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,typeProxy,lvalueCoherentFlags
                    ,opType);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &operands_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return this_local._4_4_;
  case EOpAny:
    libCall = 0x9a;
    break;
  case EOpAll:
    libCall = 0x9b;
    break;
  case EOpConstructReference:
    libCall = 0x7c;
    break;
  case EOpBitFieldReverse:
    libCall = 0xcc;
    break;
  case EOpBitCount:
    libCall = 0xcd;
    break;
  case EOpFindLSB:
    local_40 = 0x49;
    break;
  case EOpFindMSB:
    if (bVar1) {
      local_40 = 0x4b;
    }
    else {
      local_40 = 0x4a;
    }
    break;
  case EOpCountLeadingZeros:
    spv::Builder::addCapability(&this->builder,CapabilityIntegerFunctions2INTEL);
    spv::Builder::addExtension(&this->builder,"SPV_INTEL_shader_integer_functions2");
    libCall = 0x15d1;
    break;
  case EOpCountTrailingZeros:
    spv::Builder::addCapability(&this->builder,CapabilityIntegerFunctions2INTEL);
    spv::Builder::addExtension(&this->builder,"SPV_INTEL_shader_integer_functions2");
    libCall = 0x15d2;
    break;
  case EOpRayQueryProceed:
    libCall = 0x117d;
    break;
  case EOpRayQueryGetRayTMin:
    libCall = 0x1780;
    break;
  case EOpRayQueryGetRayFlags:
    libCall = 0x1781;
    break;
  case EOpRayQueryGetIntersectionCandidateAABBOpaque:
    libCall = 0x178a;
    break;
  case EOpRayQueryGetWorldRayDirection:
    libCall = 0x178d;
    break;
  case EOpRayQueryGetWorldRayOrigin:
    libCall = 0x178e;
    break;
  case EOpHitObjectIsEmptyNV:
    libCall = 0x149c;
    break;
  case EOpHitObjectIsMissNV:
    libCall = 0x149e;
    break;
  case EOpHitObjectIsHitNV:
    libCall = 0x149d;
    break;
  case EOpHitObjectGetRayTMinNV:
    libCall = 0x149b;
    break;
  case EOpHitObjectGetRayTMaxNV:
    libCall = 0x149a;
    break;
  case EOpHitObjectGetObjectRayOriginNV:
    libCall = 0x1487;
    break;
  case EOpHitObjectGetObjectRayDirectionNV:
    libCall = 0x1486;
    break;
  case EOpHitObjectGetWorldRayOriginNV:
    libCall = 0x1499;
    break;
  case EOpHitObjectGetWorldRayDirectionNV:
    libCall = 0x1498;
    break;
  case EOpHitObjectGetWorldToObjectNV:
    libCall = 0x1484;
    break;
  case EOpHitObjectGetObjectToWorldNV:
    libCall = 0x1485;
    break;
  case EOpHitObjectGetInstanceCustomIndexNV:
    libCall = 0x1497;
    break;
  case EOpHitObjectGetInstanceIdNV:
    libCall = 0x1496;
    break;
  case EOpHitObjectGetGeometryIndexNV:
    libCall = 0x1495;
    break;
  case EOpHitObjectGetPrimitiveIndexNV:
    libCall = 0x1494;
    break;
  case EOpHitObjectGetHitKindNV:
    libCall = 0x1493;
    break;
  case EOpHitObjectGetShaderBindingTableRecordIndexNV:
    libCall = 0x148a;
    break;
  case EOpHitObjectGetShaderRecordBufferHandleNV:
    libCall = 0x1489;
    break;
  case EOpHitObjectGetCurrentTimeNV:
    libCall = 0x1491;
    break;
  case EOpFetchMicroTriangleVertexPositionNV:
    libCall = 0x14b4;
    break;
  case EOpFetchMicroTriangleVertexBarycentricNV:
    libCall = 0x14b5;
    break;
  case EOpIsFinite:
    libCall = 0x9e;
    break;
  case EOpStencilAttachmentReadEXT:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
    spv::Builder::addCapability(&this->builder,CapabilityTileImageStencilReadAccessEXT);
    libCall = 0x1042;
    _operand_local->precision = DecorationRelaxedPrecision;
    break;
  case EOpDepthAttachmentReadEXT:
    spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
    spv::Builder::addCapability(&this->builder,CapabilityTileImageDepthReadAccessEXT);
    libCall = 0x1041;
    _operand_local->precision = DecorationMax;
    break;
  case EOpHitObjectGetClusterIdNV:
    libCall = 0x14e2;
    spv::Builder::addExtension(&this->builder,"SPV_NV_cluster_acceleration_structure");
    spv::Builder::addCapability(&this->builder,CapabilityShaderInvocationReorderNV);
    spv::Builder::addCapability(&this->builder,CapabilityRayTracingClusterAccelerationStructureNV);
    break;
  case EOpHitObjectGetSpherePositionNV:
    libCall = 0x1538;
    break;
  case EOpHitObjectGetSphereRadiusNV:
    libCall = 0x1539;
    break;
  case EOpHitObjectIsSphereHitNV:
    libCall = 0x153c;
    break;
  case EOpHitObjectIsLSSHitNV:
    libCall = 0x153d;
  }
  if (local_40 < 0) {
    args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::createUnaryOp(&this->builder,libCall,typeProxy_local,unaryOp);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0,&unaryOp);
    if ((int)IStack_3c < 0) {
      local_d4 = this->stdBuiltins;
    }
    else {
      local_d4 = IStack_3c;
    }
    args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::createBuiltinCall
                   (&this->builder,typeProxy_local,local_d4,local_40,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b0);
  }
  anon_unknown_0::OpDecorations::addNoContraction
            (_operand_local,&this->builder,
             args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  anon_unknown_0::OpDecorations::addNonUniform
            (_operand_local,&this->builder,
             args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  IVar3 = spv::Builder::setPrecision
                    (&this->builder,
                     args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,_operand_local->precision);
  return IVar3;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createUnaryOperation(glslang::TOperator op, OpDecorations& decorations, spv::Id typeId,
    spv::Id operand, glslang::TBasicType typeProxy, const spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags,
    const glslang::TType &opType)
{
    spv::Op unaryOp = spv::OpNop;
    int extBuiltins = -1;
    int libCall = -1;
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);

    switch (op) {
    case glslang::EOpNegative:
        if (isFloat) {
            unaryOp = spv::OpFNegate;
            if (builder.isMatrixType(typeId))
                return createUnaryMatrixOperation(unaryOp, decorations, typeId, operand, typeProxy);
        } else
            unaryOp = spv::OpSNegate;
        break;

    case glslang::EOpLogicalNot:
    case glslang::EOpVectorLogicalNot:
        unaryOp = spv::OpLogicalNot;
        break;
    case glslang::EOpBitwiseNot:
        unaryOp = spv::OpNot;
        break;

    case glslang::EOpDeterminant:
        libCall = spv::GLSLstd450Determinant;
        break;
    case glslang::EOpMatrixInverse:
        libCall = spv::GLSLstd450MatrixInverse;
        break;
    case glslang::EOpTranspose:
        unaryOp = spv::OpTranspose;
        break;

    case glslang::EOpRadians:
        libCall = spv::GLSLstd450Radians;
        break;
    case glslang::EOpDegrees:
        libCall = spv::GLSLstd450Degrees;
        break;
    case glslang::EOpSin:
        libCall = spv::GLSLstd450Sin;
        break;
    case glslang::EOpCos:
        libCall = spv::GLSLstd450Cos;
        break;
    case glslang::EOpTan:
        libCall = spv::GLSLstd450Tan;
        break;
    case glslang::EOpAcos:
        libCall = spv::GLSLstd450Acos;
        break;
    case glslang::EOpAsin:
        libCall = spv::GLSLstd450Asin;
        break;
    case glslang::EOpAtan:
        libCall = spv::GLSLstd450Atan;
        break;

    case glslang::EOpAcosh:
        libCall = spv::GLSLstd450Acosh;
        break;
    case glslang::EOpAsinh:
        libCall = spv::GLSLstd450Asinh;
        break;
    case glslang::EOpAtanh:
        libCall = spv::GLSLstd450Atanh;
        break;
    case glslang::EOpTanh:
        libCall = spv::GLSLstd450Tanh;
        break;
    case glslang::EOpCosh:
        libCall = spv::GLSLstd450Cosh;
        break;
    case glslang::EOpSinh:
        libCall = spv::GLSLstd450Sinh;
        break;

    case glslang::EOpLength:
        libCall = spv::GLSLstd450Length;
        break;
    case glslang::EOpNormalize:
        libCall = spv::GLSLstd450Normalize;
        break;

    case glslang::EOpExp:
        libCall = spv::GLSLstd450Exp;
        break;
    case glslang::EOpLog:
        libCall = spv::GLSLstd450Log;
        break;
    case glslang::EOpExp2:
        libCall = spv::GLSLstd450Exp2;
        break;
    case glslang::EOpLog2:
        libCall = spv::GLSLstd450Log2;
        break;
    case glslang::EOpSqrt:
        libCall = spv::GLSLstd450Sqrt;
        break;
    case glslang::EOpInverseSqrt:
        libCall = spv::GLSLstd450InverseSqrt;
        break;

    case glslang::EOpFloor:
        libCall = spv::GLSLstd450Floor;
        break;
    case glslang::EOpTrunc:
        libCall = spv::GLSLstd450Trunc;
        break;
    case glslang::EOpRound:
        libCall = spv::GLSLstd450Round;
        break;
    case glslang::EOpRoundEven:
        libCall = spv::GLSLstd450RoundEven;
        break;
    case glslang::EOpCeil:
        libCall = spv::GLSLstd450Ceil;
        break;
    case glslang::EOpFract:
        libCall = spv::GLSLstd450Fract;
        break;

    case glslang::EOpIsNan:
        unaryOp = spv::OpIsNan;
        break;
    case glslang::EOpIsInf:
        unaryOp = spv::OpIsInf;
        break;
    case glslang::EOpIsFinite:
        unaryOp = spv::OpIsFinite;
        break;

    case glslang::EOpFloatBitsToInt:
    case glslang::EOpFloatBitsToUint:
    case glslang::EOpIntBitsToFloat:
    case glslang::EOpUintBitsToFloat:
    case glslang::EOpDoubleBitsToInt64:
    case glslang::EOpDoubleBitsToUint64:
    case glslang::EOpInt64BitsToDouble:
    case glslang::EOpUint64BitsToDouble:
    case glslang::EOpFloat16BitsToInt16:
    case glslang::EOpFloat16BitsToUint16:
    case glslang::EOpInt16BitsToFloat16:
    case glslang::EOpUint16BitsToFloat16:
        unaryOp = spv::OpBitcast;
        break;

    case glslang::EOpPackSnorm2x16:
        libCall = spv::GLSLstd450PackSnorm2x16;
        break;
    case glslang::EOpUnpackSnorm2x16:
        libCall = spv::GLSLstd450UnpackSnorm2x16;
        break;
    case glslang::EOpPackUnorm2x16:
        libCall = spv::GLSLstd450PackUnorm2x16;
        break;
    case glslang::EOpUnpackUnorm2x16:
        libCall = spv::GLSLstd450UnpackUnorm2x16;
        break;
    case glslang::EOpPackHalf2x16:
        libCall = spv::GLSLstd450PackHalf2x16;
        break;
    case glslang::EOpUnpackHalf2x16:
        libCall = spv::GLSLstd450UnpackHalf2x16;
        break;
    case glslang::EOpPackSnorm4x8:
        libCall = spv::GLSLstd450PackSnorm4x8;
        break;
    case glslang::EOpUnpackSnorm4x8:
        libCall = spv::GLSLstd450UnpackSnorm4x8;
        break;
    case glslang::EOpPackUnorm4x8:
        libCall = spv::GLSLstd450PackUnorm4x8;
        break;
    case glslang::EOpUnpackUnorm4x8:
        libCall = spv::GLSLstd450UnpackUnorm4x8;
        break;
    case glslang::EOpPackDouble2x32:
        libCall = spv::GLSLstd450PackDouble2x32;
        break;
    case glslang::EOpUnpackDouble2x32:
        libCall = spv::GLSLstd450UnpackDouble2x32;
        break;

    case glslang::EOpPackInt2x32:
    case glslang::EOpUnpackInt2x32:
    case glslang::EOpPackUint2x32:
    case glslang::EOpUnpackUint2x32:
    case glslang::EOpPack16:
    case glslang::EOpPack32:
    case glslang::EOpPack64:
    case glslang::EOpUnpack32:
    case glslang::EOpUnpack16:
    case glslang::EOpUnpack8:
    case glslang::EOpPackInt2x16:
    case glslang::EOpUnpackInt2x16:
    case glslang::EOpPackUint2x16:
    case glslang::EOpUnpackUint2x16:
    case glslang::EOpPackInt4x16:
    case glslang::EOpUnpackInt4x16:
    case glslang::EOpPackUint4x16:
    case glslang::EOpUnpackUint4x16:
    case glslang::EOpPackFloat2x16:
    case glslang::EOpUnpackFloat2x16:
        unaryOp = spv::OpBitcast;
        break;

    case glslang::EOpDPdx:
        unaryOp = spv::OpDPdx;
        break;
    case glslang::EOpDPdy:
        unaryOp = spv::OpDPdy;
        break;
    case glslang::EOpFwidth:
        unaryOp = spv::OpFwidth;
        break;

    case glslang::EOpAny:
        unaryOp = spv::OpAny;
        break;
    case glslang::EOpAll:
        unaryOp = spv::OpAll;
        break;

    case glslang::EOpAbs:
        if (isFloat)
            libCall = spv::GLSLstd450FAbs;
        else
            libCall = spv::GLSLstd450SAbs;
        break;
    case glslang::EOpSign:
        if (isFloat)
            libCall = spv::GLSLstd450FSign;
        else
            libCall = spv::GLSLstd450SSign;
        break;

    case glslang::EOpDPdxFine:
        unaryOp = spv::OpDPdxFine;
        break;
    case glslang::EOpDPdyFine:
        unaryOp = spv::OpDPdyFine;
        break;
    case glslang::EOpFwidthFine:
        unaryOp = spv::OpFwidthFine;
        break;
    case glslang::EOpDPdxCoarse:
        unaryOp = spv::OpDPdxCoarse;
        break;
    case glslang::EOpDPdyCoarse:
        unaryOp = spv::OpDPdyCoarse;
        break;
    case glslang::EOpFwidthCoarse:
        unaryOp = spv::OpFwidthCoarse;
        break;
    case glslang::EOpRayQueryProceed:
        unaryOp = spv::OpRayQueryProceedKHR;
        break;
    case glslang::EOpRayQueryGetRayTMin:
        unaryOp = spv::OpRayQueryGetRayTMinKHR;
        break;
    case glslang::EOpRayQueryGetRayFlags:
        unaryOp = spv::OpRayQueryGetRayFlagsKHR;
        break;
    case glslang::EOpRayQueryGetWorldRayOrigin:
        unaryOp = spv::OpRayQueryGetWorldRayOriginKHR;
        break;
    case glslang::EOpRayQueryGetWorldRayDirection:
        unaryOp = spv::OpRayQueryGetWorldRayDirectionKHR;
        break;
    case glslang::EOpRayQueryGetIntersectionCandidateAABBOpaque:
        unaryOp = spv::OpRayQueryGetIntersectionCandidateAABBOpaqueKHR;
        break;
    case glslang::EOpInterpolateAtCentroid:
        if (typeProxy == glslang::EbtFloat16)
            builder.addExtension(spv::E_SPV_AMD_gpu_shader_half_float);
        libCall = spv::GLSLstd450InterpolateAtCentroid;
        break;
    case glslang::EOpAtomicCounterIncrement:
    case glslang::EOpAtomicCounterDecrement:
    case glslang::EOpAtomicCounter:
    {
        // Handle all of the atomics in one place, in createAtomicOperation()
        std::vector<spv::Id> operands;
        operands.push_back(operand);
        return createAtomicOperation(op, decorations.precision, typeId, operands, typeProxy, lvalueCoherentFlags, opType);
    }

    case glslang::EOpBitFieldReverse:
        unaryOp = spv::OpBitReverse;
        break;
    case glslang::EOpBitCount:
        unaryOp = spv::OpBitCount;
        break;
    case glslang::EOpFindLSB:
        libCall = spv::GLSLstd450FindILsb;
        break;
    case glslang::EOpFindMSB:
        if (isUnsigned)
            libCall = spv::GLSLstd450FindUMsb;
        else
            libCall = spv::GLSLstd450FindSMsb;
        break;

    case glslang::EOpCountLeadingZeros:
        builder.addCapability(spv::CapabilityIntegerFunctions2INTEL);
        builder.addExtension("SPV_INTEL_shader_integer_functions2");
        unaryOp = spv::OpUCountLeadingZerosINTEL;
        break;

    case glslang::EOpCountTrailingZeros:
        builder.addCapability(spv::CapabilityIntegerFunctions2INTEL);
        builder.addExtension("SPV_INTEL_shader_integer_functions2");
        unaryOp = spv::OpUCountTrailingZerosINTEL;
        break;

    case glslang::EOpBallot:
    case glslang::EOpReadFirstInvocation:
    case glslang::EOpAnyInvocation:
    case glslang::EOpAllInvocations:
    case glslang::EOpAllInvocationsEqual:
    case glslang::EOpMinInvocations:
    case glslang::EOpMaxInvocations:
    case glslang::EOpAddInvocations:
    case glslang::EOpMinInvocationsNonUniform:
    case glslang::EOpMaxInvocationsNonUniform:
    case glslang::EOpAddInvocationsNonUniform:
    case glslang::EOpMinInvocationsInclusiveScan:
    case glslang::EOpMaxInvocationsInclusiveScan:
    case glslang::EOpAddInvocationsInclusiveScan:
    case glslang::EOpMinInvocationsInclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
    case glslang::EOpAddInvocationsInclusiveScanNonUniform:
    case glslang::EOpMinInvocationsExclusiveScan:
    case glslang::EOpMaxInvocationsExclusiveScan:
    case glslang::EOpAddInvocationsExclusiveScan:
    case glslang::EOpMinInvocationsExclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
    case glslang::EOpAddInvocationsExclusiveScanNonUniform:
    {
        std::vector<spv::Id> operands;
        operands.push_back(operand);
        return createInvocationsOperation(op, typeId, operands, typeProxy);
    }
    case glslang::EOpSubgroupAll:
    case glslang::EOpSubgroupAny:
    case glslang::EOpSubgroupAllEqual:
    case glslang::EOpSubgroupBroadcastFirst:
    case glslang::EOpSubgroupBallot:
    case glslang::EOpSubgroupInverseBallot:
    case glslang::EOpSubgroupBallotBitCount:
    case glslang::EOpSubgroupBallotInclusiveBitCount:
    case glslang::EOpSubgroupBallotExclusiveBitCount:
    case glslang::EOpSubgroupBallotFindLSB:
    case glslang::EOpSubgroupBallotFindMSB:
    case glslang::EOpSubgroupAdd:
    case glslang::EOpSubgroupMul:
    case glslang::EOpSubgroupMin:
    case glslang::EOpSubgroupMax:
    case glslang::EOpSubgroupAnd:
    case glslang::EOpSubgroupOr:
    case glslang::EOpSubgroupXor:
    case glslang::EOpSubgroupInclusiveAdd:
    case glslang::EOpSubgroupInclusiveMul:
    case glslang::EOpSubgroupInclusiveMin:
    case glslang::EOpSubgroupInclusiveMax:
    case glslang::EOpSubgroupInclusiveAnd:
    case glslang::EOpSubgroupInclusiveOr:
    case glslang::EOpSubgroupInclusiveXor:
    case glslang::EOpSubgroupExclusiveAdd:
    case glslang::EOpSubgroupExclusiveMul:
    case glslang::EOpSubgroupExclusiveMin:
    case glslang::EOpSubgroupExclusiveMax:
    case glslang::EOpSubgroupExclusiveAnd:
    case glslang::EOpSubgroupExclusiveOr:
    case glslang::EOpSubgroupExclusiveXor:
    case glslang::EOpSubgroupQuadSwapHorizontal:
    case glslang::EOpSubgroupQuadSwapVertical:
    case glslang::EOpSubgroupQuadSwapDiagonal:
    case glslang::EOpSubgroupQuadAll:
    case glslang::EOpSubgroupQuadAny: {
        std::vector<spv::Id> operands;
        operands.push_back(operand);
        return createSubgroupOperation(op, typeId, operands, typeProxy);
    }
    case glslang::EOpMbcnt:
        extBuiltins = getExtBuiltins(spv::E_SPV_AMD_shader_ballot);
        libCall = spv::MbcntAMD;
        break;

    case glslang::EOpCubeFaceIndex:
        extBuiltins = getExtBuiltins(spv::E_SPV_AMD_gcn_shader);
        libCall = spv::CubeFaceIndexAMD;
        break;

    case glslang::EOpCubeFaceCoord:
        extBuiltins = getExtBuiltins(spv::E_SPV_AMD_gcn_shader);
        libCall = spv::CubeFaceCoordAMD;
        break;
    case glslang::EOpSubgroupPartition:
        unaryOp = spv::OpGroupNonUniformPartitionNV;
        break;
    case glslang::EOpConstructReference:
        unaryOp = spv::OpBitcast;
        break;

    case glslang::EOpConvUint64ToAccStruct:
    case glslang::EOpConvUvec2ToAccStruct:
        unaryOp = spv::OpConvertUToAccelerationStructureKHR;
        break;

    case glslang::EOpHitObjectIsEmptyNV:
        unaryOp = spv::OpHitObjectIsEmptyNV;
        break;

    case glslang::EOpHitObjectIsMissNV:
        unaryOp = spv::OpHitObjectIsMissNV;
        break;

    case glslang::EOpHitObjectIsHitNV:
        unaryOp = spv::OpHitObjectIsHitNV;
        break;

    case glslang::EOpHitObjectGetObjectRayOriginNV:
        unaryOp = spv::OpHitObjectGetObjectRayOriginNV;
        break;

    case glslang::EOpHitObjectGetObjectRayDirectionNV:
        unaryOp = spv::OpHitObjectGetObjectRayDirectionNV;
        break;

    case glslang::EOpHitObjectGetWorldRayOriginNV:
        unaryOp = spv::OpHitObjectGetWorldRayOriginNV;
        break;

    case glslang::EOpHitObjectGetWorldRayDirectionNV:
        unaryOp = spv::OpHitObjectGetWorldRayDirectionNV;
        break;

    case glslang::EOpHitObjectGetObjectToWorldNV:
        unaryOp = spv::OpHitObjectGetObjectToWorldNV;
        break;

    case glslang::EOpHitObjectGetWorldToObjectNV:
        unaryOp = spv::OpHitObjectGetWorldToObjectNV;
        break;

    case glslang::EOpHitObjectGetRayTMinNV:
        unaryOp = spv::OpHitObjectGetRayTMinNV;
        break;

    case glslang::EOpHitObjectGetRayTMaxNV:
        unaryOp = spv::OpHitObjectGetRayTMaxNV;
        break;

    case glslang::EOpHitObjectGetPrimitiveIndexNV:
        unaryOp = spv::OpHitObjectGetPrimitiveIndexNV;
        break;

    case glslang::EOpHitObjectGetInstanceIdNV:
        unaryOp = spv::OpHitObjectGetInstanceIdNV;
        break;

    case glslang::EOpHitObjectGetInstanceCustomIndexNV:
        unaryOp = spv::OpHitObjectGetInstanceCustomIndexNV;
        break;

    case glslang::EOpHitObjectGetGeometryIndexNV:
        unaryOp = spv::OpHitObjectGetGeometryIndexNV;
        break;

    case glslang::EOpHitObjectGetHitKindNV:
        unaryOp = spv::OpHitObjectGetHitKindNV;
        break;

    case glslang::EOpHitObjectGetCurrentTimeNV:
        unaryOp = spv::OpHitObjectGetCurrentTimeNV;
        break;

    case glslang::EOpHitObjectGetShaderBindingTableRecordIndexNV:
        unaryOp = spv::OpHitObjectGetShaderBindingTableRecordIndexNV;
        break;

    case glslang::EOpHitObjectGetShaderRecordBufferHandleNV:
        unaryOp = spv::OpHitObjectGetShaderRecordBufferHandleNV;
        break;

    case glslang::EOpHitObjectGetClusterIdNV:
        unaryOp = spv::OpHitObjectGetClusterIdNV;
        builder.addExtension(spv::E_SPV_NV_cluster_acceleration_structure);
        builder.addCapability(spv::CapabilityShaderInvocationReorderNV);
        builder.addCapability(spv::CapabilityRayTracingClusterAccelerationStructureNV);
        break;

    case glslang::EOpHitObjectGetSpherePositionNV:
        unaryOp = spv::OpHitObjectGetSpherePositionNV;
        break;

    case glslang::EOpHitObjectGetSphereRadiusNV:
        unaryOp = spv::OpHitObjectGetSphereRadiusNV;
        break;

    case glslang::EOpHitObjectIsSphereHitNV:
        unaryOp = spv::OpHitObjectIsSphereHitNV;
        break;

    case glslang::EOpHitObjectIsLSSHitNV:
        unaryOp = spv::OpHitObjectIsLSSHitNV;
        break;

    case glslang::EOpFetchMicroTriangleVertexPositionNV:
        unaryOp = spv::OpFetchMicroTriangleVertexPositionNV;
        break;

    case glslang::EOpFetchMicroTriangleVertexBarycentricNV:
        unaryOp = spv::OpFetchMicroTriangleVertexBarycentricNV;
        break;

    case glslang::EOpCopyObject:
        unaryOp = spv::OpCopyObject;
        break;

    case glslang::EOpDepthAttachmentReadEXT:
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);
        builder.addCapability(spv::CapabilityTileImageDepthReadAccessEXT);
        unaryOp = spv::OpDepthAttachmentReadEXT;
        decorations.precision = spv::NoPrecision;
        break;
    case glslang::EOpStencilAttachmentReadEXT:
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);
        builder.addCapability(spv::CapabilityTileImageStencilReadAccessEXT);
        unaryOp = spv::OpStencilAttachmentReadEXT;
        decorations.precision = spv::DecorationRelaxedPrecision;
        break;

    default:
        return 0;
    }

    spv::Id id;
    if (libCall >= 0) {
        std::vector<spv::Id> args;
        args.push_back(operand);
        id = builder.createBuiltinCall(typeId, extBuiltins >= 0 ? extBuiltins : stdBuiltins, libCall, args);
    } else {
        id = builder.createUnaryOp(unaryOp, typeId, operand);
    }

    decorations.addNoContraction(builder, id);
    decorations.addNonUniform(builder, id);
    return builder.setPrecision(id, decorations.precision);
}